

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceMatrixDecomposition.cpp
# Opt level: O0

void __thiscall
OpenMD::ForceMatrixDecomposition::distributeInitialData(ForceMatrixDecomposition *this)

{
  int iVar1;
  uint uVar2;
  Snapshot *pSVar3;
  ForceField *pFVar4;
  PairList *pPVar5;
  reference ppAVar6;
  reference pvVar7;
  long in_RDI;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *this_00;
  int aid;
  int j_1;
  int gid;
  int i_2;
  int i_1;
  int jglob;
  int j;
  int iglob;
  int i;
  PairList *oneFour;
  PairList *oneThree;
  PairList *oneTwo;
  PairList *excludes;
  vector<int,_std::allocator<int>_> globalGroupMembership;
  undefined4 in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  DataStorage *in_stack_fffffffffffffe80;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe88;
  AtomType *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9c;
  undefined1 in_stack_fffffffffffffe9d;
  undefined1 in_stack_fffffffffffffe9e;
  undefined1 in_stack_fffffffffffffe9f;
  SimInfo *in_stack_fffffffffffffea0;
  SimInfo *in_stack_fffffffffffffed8;
  SimInfo *in_stack_fffffffffffffef8;
  int local_f4;
  int local_ec;
  int local_e8;
  int local_d4;
  int local_cc;
  undefined1 local_98 [152];
  
  pSVar3 = SnapshotManager::getCurrentSnapshot(*(SnapshotManager **)(in_RDI + 0x10));
  *(Snapshot **)(in_RDI + 0x18) = pSVar3;
  iVar1 = SnapshotManager::getAtomStorageLayout(*(SnapshotManager **)(in_RDI + 0x10));
  *(int *)(in_RDI + 0x30) = iVar1;
  pFVar4 = SimInfo::getForceField(*(SimInfo **)(in_RDI + 8));
  *(ForceField **)(in_RDI + 0x20) = pFVar4;
  iVar1 = Snapshot::getNumberOfAtoms((Snapshot *)0x185d2e);
  *(int *)(in_RDI + 0x2b0) = iVar1;
  uVar2 = SimInfo::getNLocalCutoffGroups(in_stack_fffffffffffffea0);
  *(uint *)(in_RDI + 0x2b4) = uVar2;
  SimInfo::getIdentArray((SimInfo *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe90,
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe88);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe90);
  SimInfo::getRegions((SimInfo *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe90,
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe88);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe90);
  SimInfo::getGlobalAtomIndices(in_stack_fffffffffffffef8);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe90,
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe88);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe90);
  SimInfo::getGlobalGroupIndices(in_stack_fffffffffffffed8);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe90,
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe88);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe90);
  SimInfo::getGlobalGroupMembership
            ((SimInfo *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  SimInfo::getMassFactors((SimInfo *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  pFVar4 = (ForceField *)local_98;
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe90,
             in_stack_fffffffffffffe88);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe90);
  SimInfo::getExcludedInteractions(*(SimInfo **)(in_RDI + 8));
  pPVar5 = SimInfo::getOneTwoInteractions(*(SimInfo **)(in_RDI + 8));
  SimInfo::getOneThreeInteractions(*(SimInfo **)(in_RDI + 8));
  SimInfo::getOneFourInteractions(*(SimInfo **)(in_RDI + 8));
  if ((*(byte *)(in_RDI + 0x3c) & 1) == 0) {
    DataStorage::setStorageLayout(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
  }
  else {
    DataStorage::setStorageLayout(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::clear((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           *)0x185fd8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)in_stack_fffffffffffffea0,
           CONCAT17(in_stack_fffffffffffffe9f,
                    CONCAT16(in_stack_fffffffffffffe9e,
                             CONCAT15(in_stack_fffffffffffffe9d,
                                      CONCAT14(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98))
                            )));
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::clear((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           *)0x18600c);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)in_stack_fffffffffffffea0,
           CONCAT17(in_stack_fffffffffffffe9f,
                    CONCAT16(in_stack_fffffffffffffe9e,
                             CONCAT15(in_stack_fffffffffffffe9d,
                                      CONCAT14(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98))
                            )));
  this_00 = (vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)(in_RDI + 0x1f8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::clear((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           *)0x186040);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)this_00,
           CONCAT17(in_stack_fffffffffffffe9f,
                    CONCAT16(in_stack_fffffffffffffe9e,
                             CONCAT15(in_stack_fffffffffffffe9d,
                                      CONCAT14(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98))
                            )));
  for (local_cc = 0; local_cc < *(int *)(in_RDI + 0x2b0); local_cc = local_cc + 1) {
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2b8),(long)local_cc);
    for (local_d4 = 0; local_d4 < *(int *)(in_RDI + 0x2b0); local_d4 = local_d4 + 1) {
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2b8),(long)local_d4);
      in_stack_fffffffffffffe9f =
           PairList::hasPair((PairList *)
                             CONCAT17(in_stack_fffffffffffffe9f,
                                      CONCAT16(in_stack_fffffffffffffe9e,
                                               CONCAT15(in_stack_fffffffffffffe9d,
                                                        CONCAT14(in_stack_fffffffffffffe9c,
                                                                 in_stack_fffffffffffffe98)))),
                             (int)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                             (int)in_stack_fffffffffffffe90);
      if ((bool)in_stack_fffffffffffffe9f) {
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)(in_RDI + 0x210),(long)local_cc);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe90,
                   (value_type_conflict2 *)in_stack_fffffffffffffe88);
      }
      in_stack_fffffffffffffe9e =
           PairList::hasPair((PairList *)
                             CONCAT17(in_stack_fffffffffffffe9f,
                                      CONCAT16(in_stack_fffffffffffffe9e,
                                               CONCAT15(in_stack_fffffffffffffe9d,
                                                        CONCAT14(in_stack_fffffffffffffe9c,
                                                                 in_stack_fffffffffffffe98)))),
                             (int)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                             (int)in_stack_fffffffffffffe90);
      if ((bool)in_stack_fffffffffffffe9e) {
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)(in_RDI + 0x1e0),(long)local_cc);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe90,
                   (value_type_conflict2 *)in_stack_fffffffffffffe88);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)(in_RDI + 0x1f8),(long)local_cc);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe80,
                   (value_type_conflict2 *)
                   CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      }
      else {
        in_stack_fffffffffffffe9d =
             PairList::hasPair((PairList *)
                               CONCAT17(in_stack_fffffffffffffe9f,
                                        CONCAT16(in_stack_fffffffffffffe9e,
                                                 CONCAT15(in_stack_fffffffffffffe9d,
                                                          CONCAT14(in_stack_fffffffffffffe9c,
                                                                   in_stack_fffffffffffffe98)))),
                               (int)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                               (int)in_stack_fffffffffffffe90);
        if ((bool)in_stack_fffffffffffffe9d) {
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        *)(in_RDI + 0x1e0),(long)local_cc);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe90,
                     (value_type_conflict2 *)in_stack_fffffffffffffe88);
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        *)(in_RDI + 0x1f8),(long)local_cc);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe80,
                     (value_type_conflict2 *)
                     CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        }
        else {
          in_stack_fffffffffffffe9c =
               PairList::hasPair((PairList *)
                                 CONCAT17(in_stack_fffffffffffffe9f,
                                          CONCAT16(in_stack_fffffffffffffe9e,
                                                   CONCAT15(in_stack_fffffffffffffe9d,
                                                            CONCAT14(in_stack_fffffffffffffe9c,
                                                                     in_stack_fffffffffffffe98)))),
                                 (int)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                                 (int)in_stack_fffffffffffffe90);
          if ((bool)in_stack_fffffffffffffe9c) {
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          *)(in_RDI + 0x1e0),(long)local_cc);
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe90,
                       (value_type_conflict2 *)in_stack_fffffffffffffe88);
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          *)(in_RDI + 0x1f8),(long)local_cc);
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe80,
                       (value_type_conflict2 *)
                       CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
          }
        }
      }
    }
  }
  std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::resize
            (this_00,CONCAT17(in_stack_fffffffffffffe9f,
                              CONCAT16(in_stack_fffffffffffffe9e,
                                       CONCAT15(in_stack_fffffffffffffe9d,
                                                CONCAT14(in_stack_fffffffffffffe9c,
                                                         in_stack_fffffffffffffe98)))));
  for (local_e8 = 0; local_e8 < *(int *)(in_RDI + 0x2b0); local_e8 = local_e8 + 1) {
    in_stack_fffffffffffffe88 = *(vector<double,_std::allocator<double>_> **)(in_RDI + 0x20);
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x60),(long)local_e8);
    in_stack_fffffffffffffe90 = ForceField::getAtomType(pFVar4,(int)((ulong)pPVar5 >> 0x20));
    ppAVar6 = std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::operator[]
                        ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
                         (in_RDI + 600),(long)local_e8);
    *ppAVar6 = in_stack_fffffffffffffe90;
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::clear((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           *)0x18640c);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)this_00,
           CONCAT17(in_stack_fffffffffffffe9f,
                    CONCAT16(in_stack_fffffffffffffe9e,
                             CONCAT15(in_stack_fffffffffffffe9d,
                                      CONCAT14(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98))
                            )));
  for (local_ec = 0; local_ec < *(int *)(in_RDI + 0x2b4); local_ec = local_ec + 1) {
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2d0),(long)local_ec);
    iVar1 = *pvVar7;
    for (local_f4 = 0; local_f4 < *(int *)(in_RDI + 0x2b0); local_f4 = local_f4 + 1) {
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2b8),(long)local_f4);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_98 + 0x18),(long)*pvVar7);
      if (*pvVar7 == iVar1) {
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)(in_RDI + 0x228),(long)local_ec);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe90,
                   (value_type_conflict2 *)in_stack_fffffffffffffe88);
      }
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe90);
  return;
}

Assistant:

void ForceMatrixDecomposition::distributeInitialData() {
    snap_              = sman_->getCurrentSnapshot();
    atomStorageLayout_ = sman_->getAtomStorageLayout();
    ff_                = info_->getForceField();
    nLocal_            = snap_->getNumberOfAtoms();

    nGroups_ = info_->getNLocalCutoffGroups();
    // gather the information for atomtype IDs (atids):
    idents                            = info_->getIdentArray();
    regions                           = info_->getRegions();
    AtomLocalToGlobal                 = info_->getGlobalAtomIndices();
    cgLocalToGlobal                   = info_->getGlobalGroupIndices();
    vector<int> globalGroupMembership = info_->getGlobalGroupMembership();

    massFactors = info_->getMassFactors();

    PairList* excludes = info_->getExcludedInteractions();
    PairList* oneTwo   = info_->getOneTwoInteractions();
    PairList* oneThree = info_->getOneThreeInteractions();
    PairList* oneFour  = info_->getOneFourInteractions();

    if (needVelocities_)
      snap_->cgData.setStorageLayout(DataStorage::dslPosition |
                                     DataStorage::dslVelocity);
    else
      snap_->cgData.setStorageLayout(DataStorage::dslPosition);

#ifdef IS_MPI

    MPI_Comm row = rowComm.getComm();
    MPI_Comm col = colComm.getComm();

    AtomPlanIntRow    = new Plan<int>(row, nLocal_);
    AtomPlanRealRow   = new Plan<RealType>(row, nLocal_);
    AtomPlanVectorRow = new Plan<Vector3d>(row, nLocal_);
    AtomPlanMatrixRow = new Plan<Mat3x3d>(row, nLocal_);
    AtomPlanPotRow    = new Plan<potVec>(row, nLocal_);

    AtomPlanIntColumn    = new Plan<int>(col, nLocal_);
    AtomPlanRealColumn   = new Plan<RealType>(col, nLocal_);
    AtomPlanVectorColumn = new Plan<Vector3d>(col, nLocal_);
    AtomPlanMatrixColumn = new Plan<Mat3x3d>(col, nLocal_);
    AtomPlanPotColumn    = new Plan<potVec>(col, nLocal_);

    cgPlanIntRow       = new Plan<int>(row, nGroups_);
    cgPlanVectorRow    = new Plan<Vector3d>(row, nGroups_);
    cgPlanIntColumn    = new Plan<int>(col, nGroups_);
    cgPlanVectorColumn = new Plan<Vector3d>(col, nGroups_);

    nAtomsInRow_  = AtomPlanIntRow->getSize();
    nAtomsInCol_  = AtomPlanIntColumn->getSize();
    nGroupsInRow_ = cgPlanIntRow->getSize();
    nGroupsInCol_ = cgPlanIntColumn->getSize();

    // Modify the data storage objects with the correct layouts and sizes:
    atomRowData.resize(nAtomsInRow_);
    atomRowData.setStorageLayout(atomStorageLayout_);
    atomColData.resize(nAtomsInCol_);
    atomColData.setStorageLayout(atomStorageLayout_);
    cgRowData.resize(nGroupsInRow_);
    cgRowData.setStorageLayout(DataStorage::dslPosition);
    cgColData.resize(nGroupsInCol_);
    if (needVelocities_)
      // we only need column velocities if we need them.
      cgColData.setStorageLayout(DataStorage::dslPosition |
                                 DataStorage::dslVelocity);
    else
      cgColData.setStorageLayout(DataStorage::dslPosition);

    identsRow.resize(nAtomsInRow_);
    identsCol.resize(nAtomsInCol_);

    AtomPlanIntRow->gather(idents, identsRow);
    AtomPlanIntColumn->gather(idents, identsCol);

    regionsRow.resize(nAtomsInRow_);
    regionsCol.resize(nAtomsInCol_);

    AtomPlanIntRow->gather(regions, regionsRow);
    AtomPlanIntColumn->gather(regions, regionsCol);

    // allocate memory for the parallel objects
    atypesRow.resize(nAtomsInRow_);
    atypesCol.resize(nAtomsInCol_);

    for (int i = 0; i < nAtomsInRow_; i++)
      atypesRow[i] = ff_->getAtomType(identsRow[i]);
    for (int i = 0; i < nAtomsInCol_; i++)
      atypesCol[i] = ff_->getAtomType(identsCol[i]);

    pot_row.resize(nAtomsInRow_);
    pot_col.resize(nAtomsInCol_);

    expot_row.resize(nAtomsInRow_);
    expot_col.resize(nAtomsInCol_);

    selepot_row.resize(nAtomsInRow_);
    selepot_col.resize(nAtomsInCol_);

    AtomRowToGlobal.resize(nAtomsInRow_);
    AtomColToGlobal.resize(nAtomsInCol_);
    AtomPlanIntRow->gather(AtomLocalToGlobal, AtomRowToGlobal);
    AtomPlanIntColumn->gather(AtomLocalToGlobal, AtomColToGlobal);

    cgRowToGlobal.resize(nGroupsInRow_);
    cgColToGlobal.resize(nGroupsInCol_);
    cgPlanIntRow->gather(cgLocalToGlobal, cgRowToGlobal);
    cgPlanIntColumn->gather(cgLocalToGlobal, cgColToGlobal);

    massFactorsRow.resize(nAtomsInRow_);
    massFactorsCol.resize(nAtomsInCol_);
    AtomPlanRealRow->gather(massFactors, massFactorsRow);
    AtomPlanRealColumn->gather(massFactors, massFactorsCol);

    groupListRow_.clear();
    groupListRow_.resize(nGroupsInRow_);
    for (int i = 0; i < nGroupsInRow_; i++) {
      int gid = cgRowToGlobal[i];
      for (int j = 0; j < nAtomsInRow_; j++) {
        int aid = AtomRowToGlobal[j];
        if (globalGroupMembership[aid] == gid) groupListRow_[i].push_back(j);
      }
    }

    groupListCol_.clear();
    groupListCol_.resize(nGroupsInCol_);
    for (int i = 0; i < nGroupsInCol_; i++) {
      int gid = cgColToGlobal[i];
      for (int j = 0; j < nAtomsInCol_; j++) {
        int aid = AtomColToGlobal[j];
        if (globalGroupMembership[aid] == gid) groupListCol_[i].push_back(j);
      }
    }

    excludesForAtom.clear();
    excludesForAtom.resize(nAtomsInRow_);
    toposForAtom.clear();
    toposForAtom.resize(nAtomsInRow_);
    topoDist.clear();
    topoDist.resize(nAtomsInRow_);
    for (int i = 0; i < nAtomsInRow_; i++) {
      int iglob = AtomRowToGlobal[i];

      for (int j = 0; j < nAtomsInCol_; j++) {
        int jglob = AtomColToGlobal[j];

        if (excludes->hasPair(iglob, jglob)) excludesForAtom[i].push_back(j);

        if (oneTwo->hasPair(iglob, jglob)) {
          toposForAtom[i].push_back(j);
          topoDist[i].push_back(1);
        } else {
          if (oneThree->hasPair(iglob, jglob)) {
            toposForAtom[i].push_back(j);
            topoDist[i].push_back(2);
          } else {
            if (oneFour->hasPair(iglob, jglob)) {
              toposForAtom[i].push_back(j);
              topoDist[i].push_back(3);
            }
          }
        }
      }
    }

#else
    excludesForAtom.clear();
    excludesForAtom.resize(nLocal_);
    toposForAtom.clear();
    toposForAtom.resize(nLocal_);
    topoDist.clear();
    topoDist.resize(nLocal_);

    for (int i = 0; i < nLocal_; i++) {
      int iglob = AtomLocalToGlobal[i];

      for (int j = 0; j < nLocal_; j++) {
        int jglob = AtomLocalToGlobal[j];

        if (excludes->hasPair(iglob, jglob)) excludesForAtom[i].push_back(j);

        if (oneTwo->hasPair(iglob, jglob)) {
          toposForAtom[i].push_back(j);
          topoDist[i].push_back(1);
        } else {
          if (oneThree->hasPair(iglob, jglob)) {
            toposForAtom[i].push_back(j);
            topoDist[i].push_back(2);
          } else {
            if (oneFour->hasPair(iglob, jglob)) {
              toposForAtom[i].push_back(j);
              topoDist[i].push_back(3);
            }
          }
        }
      }
    }
#endif

    // allocate memory for the parallel objects
    atypesLocal.resize(nLocal_);

    for (int i = 0; i < nLocal_; i++)
      atypesLocal[i] = ff_->getAtomType(idents[i]);

    groupList_.clear();
    groupList_.resize(nGroups_);
    for (int i = 0; i < nGroups_; i++) {
      int gid = cgLocalToGlobal[i];
      for (int j = 0; j < nLocal_; j++) {
        int aid = AtomLocalToGlobal[j];
        if (globalGroupMembership[aid] == gid) { groupList_[i].push_back(j); }
      }
    }
  }